

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaRex.c
# Opt level: O2

int Gia_ManRexNumInputs(char *pStr,Vec_Int_t **pvAlphas,Vec_Int_t **pvStr2Sta)

{
  byte bVar1;
  int iVar2;
  size_t sVar3;
  Vec_Int_t *p;
  Vec_Int_t *p_00;
  int Entry;
  ulong uVar4;
  ulong uVar5;
  
  sVar3 = strlen(pStr);
  p = Vec_IntAlloc(100);
  p_00 = Vec_IntStartFull((int)sVar3 + 1);
  uVar5 = 0;
  uVar4 = sVar3 & 0xffffffff;
  if ((int)sVar3 < 1) {
    uVar4 = uVar5;
  }
  Entry = 0;
  for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
    bVar1 = pStr[uVar5];
    if ((2 < bVar1 - 0x28) && (bVar1 != 0x7c)) {
      iVar2 = Vec_IntFind(p,(int)(char)bVar1);
      if (iVar2 == -1) {
        Vec_IntPush(p,(int)(char)bVar1);
      }
      Vec_IntWriteEntry(p_00,(int)uVar5,Entry);
      Entry = Entry + 1;
    }
  }
  Vec_IntWriteEntry(p_00,(int)uVar4,Entry);
  *pvAlphas = p;
  *pvStr2Sta = p_00;
  return Entry;
}

Assistant:

int Gia_ManRexNumInputs( char * pStr, Vec_Int_t ** pvAlphas, Vec_Int_t ** pvStr2Sta )
{
    int i, nStates = 0, Length = strlen(pStr);
    Vec_Int_t * vAlphas  = Vec_IntAlloc( 100 );            // alphabet
    Vec_Int_t * vStr2Sta = Vec_IntStartFull( Length + 1 ); // symbol to state
    for ( i = 0; i < Length; i++ )
    {
        if ( Gia_SymbSpecial(pStr[i]) )
            continue;
        if ( Vec_IntFind(vAlphas, pStr[i]) == -1 )
            Vec_IntPush( vAlphas, pStr[i] );
        Vec_IntWriteEntry( vStr2Sta, i, nStates++ );
    }
    Vec_IntWriteEntry( vStr2Sta, i, nStates );
    *pvAlphas  = vAlphas;
    *pvStr2Sta = vStr2Sta;
    return nStates;
}